

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::NuttallWindow(int y_length,double *y)

{
  long in_RSI;
  int in_EDI;
  double dVar1;
  double dVar2;
  double dVar3;
  int i;
  double tmp;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    dVar1 = (double)local_1c / ((double)in_EDI - 1.0);
    dVar2 = cos(dVar1 * 6.283185307179586);
    dVar3 = cos(dVar1 * 12.566370614359172);
    dVar1 = cos(dVar1 * 18.84955592153876);
    *(double *)(in_RSI + (long)local_1c * 8) =
         dVar1 * -0.012604 + dVar3 * 0.144232 + dVar2 * -0.487396 + 0.355768;
  }
  return;
}

Assistant:

void NuttallWindow(int y_length, double *y) {
  double tmp;
  for (int i = 0; i < y_length; ++i) {
    tmp  = i / (y_length - 1.0);
    y[i] = 0.355768 - 0.487396 * cos(2.0 * world::kPi * tmp) +
      0.144232 * cos(4.0 * world::kPi * tmp) -
      0.012604 * cos(6.0 * world::kPi * tmp);
  }
}